

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O1

bool Js::AsmJSCompiler::CheckFunctionsSequential(AsmJsModuleCompiler *m)

{
  AsmJSParser *ppPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeFnc *fncNode;
  AsmJSParser this;
  
  ppPVar1 = m->mCurrentParserNode;
  if ((*ppPVar1)->nop != knopList) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2c3,"(list->nop == knopList)","list->nop == knopList");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this = *ppPVar1;
  while( true ) {
    pPVar5 = ParseNode::AsParseNodeBin(this);
    if (pPVar5->pnode1->nop != knopFncDecl) break;
    fncNode = ParseNode::AsParseNodeFnc(pPVar5->pnode1);
    bVar3 = CheckFunction(m,fncNode);
    if (!bVar3) {
      return false;
    }
    pPVar5 = ParseNode::AsParseNodeBin(*ppPVar1);
    if (pPVar5->pnode2->nop == knopEndCode) break;
    pPVar5 = ParseNode::AsParseNodeBin(*ppPVar1);
    this = pPVar5->pnode2;
    *ppPVar1 = this;
  }
  *m->mCurrentParserNode = *ppPVar1;
  return true;
}

Assistant:

bool AsmJSCompiler::CheckFunctionsSequential( AsmJsModuleCompiler &m )
    {
        AsmJSParser& list = m.GetCurrentParserNode();
        Assert( list->nop == knopList );


        ParseNode* pnode = ParserWrapper::GetBinaryLeft(list);

        while (pnode->nop == knopFncDecl)
        {
            if( !CheckFunction( m, pnode->AsParseNodeFnc() ) )
            {
                return false;
            }

            if(ParserWrapper::GetBinaryRight(list)->nop == knopEndCode)
            {
                break;
            }
            list = ParserWrapper::GetBinaryRight(list);
            pnode = ParserWrapper::GetBinaryLeft(list);
        }

        m.SetCurrentParseNode( list );

        return true;
    }